

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yyrefill(GREG *G)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  iVar1 = G->buflen;
  iVar3 = iVar1 - G->pos;
  while (iVar3 < 0x200) {
    G->buflen = iVar1 * 2;
    pcVar2 = (char *)realloc(G->buf,(long)(iVar1 * 2));
    G->buf = pcVar2;
    iVar1 = G->buflen;
    iVar3 = iVar1 - G->pos;
  }
  iVar1 = getc((FILE *)input);
  iVar3 = 0;
  if ((iVar1 != -1) &&
     (((iVar1 != 0xd && (iVar1 != 10)) || (lineNumber = lineNumber + 1, iVar1 != -1)))) {
    G->buf[G->pos] = (char)iVar1;
    G->limit = G->limit + 1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

YY_LOCAL(int) yyrefill(GREG *G)
{
  int yyn;
  while (G->buflen - G->pos < 512)
    {
      G->buflen *= 2;
      G->buf= (char*)YY_REALLOC(G->buf, G->buflen, G->data);
    }
  YY_INPUT((G->buf + G->pos), yyn, (G->buflen - G->pos), G->data);
  if (!yyn) return 0;
  G->limit += yyn;
  return 1;
}